

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error asmjit::Logging::formatOperand
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Operand_ *op)

{
  uint uVar1;
  Error EVar2;
  Error EVar3;
  ulong uVar4;
  uint32_t uVar5;
  char *str;
  uint32_t uVar6;
  ulong i;
  bool bVar7;
  
  uVar1 = (op->field_0)._any.signature;
  switch(uVar1 & 7) {
  case 1:
    EVar2 = X86Logging::formatRegister
                      (sb,logOptions,emitter,0x503,uVar1 >> 3 & 0x1f,(op->field_0)._any.id);
    return EVar2;
  case 2:
    break;
  case 3:
    uVar4 = *(ulong *)((long)&op->field_0 + 8);
    if (uVar4 < 10 || (logOptions & 4) == 0) {
      uVar5 = 10;
      uVar6 = 0x80000000;
    }
    else {
      uVar5 = 0x10;
      uVar6 = 0;
    }
    EVar2 = StringBuilder::_opNumber(sb,1,uVar4,uVar5,0,uVar6);
    return EVar2;
  case 4:
    EVar2 = formatLabel(sb,logOptions,emitter,(op->field_0)._any.id);
    return EVar2;
  default:
    EVar2 = StringBuilder::_opString(sb,1,"<None>",0xffffffffffffffff);
    return EVar2;
  }
  uVar1 = uVar1 >> 0x18;
  switch(uVar1) {
  case 1:
    str = "byte ";
    break;
  case 2:
    str = "word ";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_00163e94_caseD_3:
    str = "";
    break;
  case 4:
    str = "dword ";
    break;
  case 6:
    str = "fword ";
    break;
  case 8:
    str = "qword ";
    break;
  case 10:
    str = "tword ";
    break;
  case 0x10:
    str = "oword ";
    break;
  default:
    if (uVar1 == 0x20) {
      str = "yword ";
    }
    else {
      if (uVar1 != 0x40) goto switchD_00163e94_caseD_3;
      str = "zword ";
    }
  }
  EVar2 = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
  if (EVar2 != 0) {
    return EVar2;
  }
  uVar1 = (op->field_0)._any.signature >> 0x15 & 7;
  uVar5 = uVar1 - 1;
  if (uVar5 < 6) {
    uVar5 = 0x177720;
    EVar2 = StringBuilder::appendFormat(sb,"%s:",(ulong)uVar1 * 4 + 0x177800);
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  uVar6 = 1;
  EVar2 = StringBuilder::_opChar(sb,1,'[');
  if (EVar2 != 0) {
    return EVar2;
  }
  if (((op->field_0)._any.signature & 0x6000) == 0x2000) {
    uVar6 = 1;
    uVar5 = 0xffffffff;
    EVar2 = StringBuilder::_opString(sb,1,"abs ",0xffffffffffffffff);
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  uVar1 = (op->field_0)._any.signature;
  if ((uVar1 & 0xf8) != 0) {
    uVar5 = uVar1 & 0xf8;
    if (uVar5 == 8) {
      uVar5 = (op->field_0)._any.reserved12_4;
      EVar2 = formatLabel(sb,logOptions,emitter,uVar5);
    }
    else {
      if ((short)uVar1 < 0) {
        uVar6 = 1;
        uVar5 = 0xffffffff;
        EVar2 = StringBuilder::_opString(sb,1,"$",0xffffffffffffffff);
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      if ((undefined1  [16])((undefined1  [16])op->field_0 & (undefined1  [16])0x10000) !=
          (undefined1  [16])0x0) {
        uVar6 = 1;
        uVar5 = 0xffffffff;
        EVar2 = StringBuilder::_opString(sb,1,"&",0xffffffffffffffff);
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      EVar2 = X86Logging::formatRegister
                        (sb,uVar6,emitter,uVar5,(op->field_0)._any.signature >> 3 & 0x1f,
                         (op->field_0)._any.reserved12_4);
    }
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  if ((undefined1  [16])((undefined1  [16])op->field_0 & (undefined1  [16])0x1f00) !=
      (undefined1  [16])0x0) {
    uVar6 = 1;
    EVar2 = StringBuilder::_opChar(sb,1,'+');
    if (EVar2 != 0) {
      return EVar2;
    }
    EVar2 = X86Logging::formatRegister
                      (sb,uVar6,emitter,uVar5,(op->field_0)._any.signature >> 8 & 0x1f,
                       (op->field_0)._any.id);
    if (EVar2 != 0) {
      return EVar2;
    }
    uVar1 = (op->field_0)._any.signature;
    if (((uVar1 & 0x180000) != 0) &&
       (EVar2 = StringBuilder::appendFormat
                          (sb,"*%u",(ulong)(uint)(1 << ((byte)(uVar1 >> 0x13) & 3))), EVar2 != 0)) {
      return EVar2;
    }
  }
  if ((undefined1  [16])((undefined1  [16])op->field_0 & (undefined1  [16])0xf8) ==
      (undefined1  [16])0x0) {
    uVar4 = *(ulong *)((long)&op->field_0 + 8);
  }
  else {
    uVar4 = (ulong)(int)(op->field_0)._any.reserved8_4;
  }
  if (uVar4 == 0) goto LAB_001641b2;
  i = -uVar4;
  if (0 < (long)uVar4) {
    i = uVar4;
  }
  EVar2 = StringBuilder::_opChar(sb,1,(char)((long)uVar4 >> 0x3f) * -2 + '+');
  if (EVar2 == 0) {
    uVar5 = 10;
    if (((logOptions & 8) != 0) && (9 < i)) {
      EVar2 = StringBuilder::_opString(sb,1,"0x",2);
      if (EVar2 != 0) goto LAB_00164150;
      uVar5 = 0x10;
    }
    EVar3 = StringBuilder::_opNumber(sb,1,i,uVar5,0,0);
    bVar7 = EVar3 == 0;
    EVar2 = 0;
    if (!bVar7) {
      EVar2 = EVar3;
    }
  }
  else {
LAB_00164150:
    bVar7 = false;
  }
  if (!bVar7) {
    return EVar2;
  }
LAB_001641b2:
  EVar2 = StringBuilder::_opChar(sb,1,']');
  return EVar2;
}

Assistant:

Error Logging::formatOperand(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Operand_& op) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatOperand(sb, logOptions, emitter, archType, op);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}